

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  ssl_peer *peer;
  undefined8 uVar1;
  curltime cVar2;
  undefined4 uStack_4c;
  CURLcode local_44;
  CURLcode result;
  cf_call_data save;
  ssl_connect_data *connssl;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  peer = (ssl_peer *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    if (cf->next == (Curl_cfilter *)0x0) {
      *done = false;
      cf_local._4_4_ = CURLE_FAILED_INIT;
    }
    else if (((cf->next->field_0x24 & 1) != 0) ||
            ((cf_local._4_4_ = (*cf->next->cft->do_connect)(cf->next,data,blocking,done),
             cf_local._4_4_ == CURLE_OK && ((*done & 1U) != 0)))) {
      uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
      *(Curl_easy **)((long)cf->ctx + 0x38) = data;
      if ((data != (Curl_easy *)0x0) &&
         (((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0 &&
          (((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
            && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)))))) {
        Curl_trc_cf_infof(data,cf,"cf_connect()");
      }
      *done = false;
      if ((peer->hostname != (char *)0x0) ||
         (local_44 = Curl_ssl_peer_init(peer,cf,3), local_44 == CURLE_OK)) {
        if (blocking) {
          local_44 = ssl_connect(cf,data);
          *done = local_44 == CURLE_OK;
        }
        else {
          local_44 = ssl_connect_nonblocking(cf,data,done);
        }
        if ((local_44 == CURLE_OK) && ((*done & 1U) != 0)) {
          cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
          cVar2 = Curl_now();
          peer[1].type = (int)cVar2.tv_sec;
          peer[1].port = (int)((ulong)cVar2.tv_sec >> 0x20);
          *(ulong *)&peer[1].transport = CONCAT44(uStack_4c,cVar2.tv_usec);
        }
      }
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"cf_connect() -> %d, done=%d",(ulong)local_44,(ulong)(*done & 1));
      }
      *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
      cf_local._4_4_ = local_44;
    }
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ssl_cf_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(!cf->next) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  if(!cf->next->connected) {
    result = cf->next->cft->do_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  CF_DATA_SAVE(save, cf, data);
  CURL_TRC_CF(data, cf, "cf_connect()");
  DEBUGASSERT(data->conn);
  DEBUGASSERT(data->conn == cf->conn);
  DEBUGASSERT(connssl);

  *done = FALSE;
  if(!connssl->peer.hostname) {
    result = Curl_ssl_peer_init(&connssl->peer, cf, TRNSPRT_TCP);
    if(result)
      goto out;
  }

  if(blocking) {
    result = ssl_connect(cf, data);
    *done = (result == CURLE_OK);
  }
  else {
    result = ssl_connect_nonblocking(cf, data, done);
  }

  if(!result && *done) {
    cf->connected = TRUE;
    connssl->handshake_done = Curl_now();
    /* Connection can be deferred when sending early data */
    DEBUGASSERT(connssl->state == ssl_connection_complete ||
                connssl->state == ssl_connection_deferred);
  }
out:
  CURL_TRC_CF(data, cf, "cf_connect() -> %d, done=%d", result, *done);
  CF_DATA_RESTORE(cf, save);
  return result;
}